

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O0

void __thiscall FTextureManager::DeleteAll(FTextureManager *this)

{
  uint uVar1;
  TextureHash *pTVar2;
  FAnimDef **ppFVar3;
  FSwitchDef **ppFVar4;
  FDoorAnimation *pFVar5;
  uchar **ppuVar6;
  uint local_24;
  uint local_20;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  FTextureManager *this_local;
  
  i_2 = 0;
  while( true ) {
    uVar1 = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::Size
                      (&this->Textures);
    if (uVar1 <= i_2) break;
    pTVar2 = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::operator[]
                       (&this->Textures,(ulong)i_2);
    if (pTVar2->Texture != (FTexture *)0x0) {
      (*pTVar2->Texture->_vptr_FTexture[1])();
    }
    i_2 = i_2 + 1;
  }
  TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::Clear(&this->Textures);
  TArray<int,_int>::Clear(&this->Translation);
  TArray<int,_int>::Clear(&this->FirstTextureForFile);
  memset(this->HashFirst,0xff,0x100c);
  FTextureID::SetInvalid(&this->DefaultTexture);
  i_3 = 0;
  while( true ) {
    uVar1 = TArray<FAnimDef_*,_FAnimDef_*>::Size(&this->mAnimations);
    if (uVar1 <= i_3) break;
    ppFVar3 = TArray<FAnimDef_*,_FAnimDef_*>::operator[](&this->mAnimations,(ulong)i_3);
    if (*ppFVar3 != (FAnimDef *)0x0) {
      ppFVar3 = TArray<FAnimDef_*,_FAnimDef_*>::operator[](&this->mAnimations,(ulong)i_3);
      M_Free(*ppFVar3);
      ppFVar3 = TArray<FAnimDef_*,_FAnimDef_*>::operator[](&this->mAnimations,(ulong)i_3);
      *ppFVar3 = (FAnimDef *)0x0;
    }
    i_3 = i_3 + 1;
  }
  TArray<FAnimDef_*,_FAnimDef_*>::Clear(&this->mAnimations);
  i_4 = 0;
  while( true ) {
    uVar1 = TArray<FSwitchDef_*,_FSwitchDef_*>::Size(&this->mSwitchDefs);
    if (uVar1 <= i_4) break;
    ppFVar4 = TArray<FSwitchDef_*,_FSwitchDef_*>::operator[](&this->mSwitchDefs,(ulong)i_4);
    if (*ppFVar4 != (FSwitchDef *)0x0) {
      ppFVar4 = TArray<FSwitchDef_*,_FSwitchDef_*>::operator[](&this->mSwitchDefs,(ulong)i_4);
      M_Free(*ppFVar4);
      ppFVar4 = TArray<FSwitchDef_*,_FSwitchDef_*>::operator[](&this->mSwitchDefs,(ulong)i_4);
      *ppFVar4 = (FSwitchDef *)0x0;
    }
    i_4 = i_4 + 1;
  }
  TArray<FSwitchDef_*,_FSwitchDef_*>::Clear(&this->mSwitchDefs);
  local_20 = 0;
  while( true ) {
    uVar1 = TArray<FDoorAnimation,_FDoorAnimation>::Size(&this->mAnimatedDoors);
    if (uVar1 <= local_20) break;
    pFVar5 = TArray<FDoorAnimation,_FDoorAnimation>::operator[]
                       (&this->mAnimatedDoors,(ulong)local_20);
    if (pFVar5->TextureFrames != (FTextureID *)0x0) {
      pFVar5 = TArray<FDoorAnimation,_FDoorAnimation>::operator[]
                         (&this->mAnimatedDoors,(ulong)local_20);
      if (pFVar5->TextureFrames != (FTextureID *)0x0) {
        operator_delete__(pFVar5->TextureFrames);
      }
      pFVar5 = TArray<FDoorAnimation,_FDoorAnimation>::operator[]
                         (&this->mAnimatedDoors,(ulong)local_20);
      pFVar5->TextureFrames = (FTextureID *)0x0;
    }
    local_20 = local_20 + 1;
  }
  TArray<FDoorAnimation,_FDoorAnimation>::Clear(&this->mAnimatedDoors);
  local_24 = 0;
  while( true ) {
    uVar1 = TArray<unsigned_char_*,_unsigned_char_*>::Size(&this->BuildTileFiles);
    if (uVar1 <= local_24) break;
    ppuVar6 = TArray<unsigned_char_*,_unsigned_char_*>::operator[]
                        (&this->BuildTileFiles,(ulong)local_24);
    if (*ppuVar6 != (uchar *)0x0) {
      operator_delete__(*ppuVar6);
    }
    local_24 = local_24 + 1;
  }
  TArray<unsigned_char_*,_unsigned_char_*>::Clear(&this->BuildTileFiles);
  return;
}

Assistant:

void FTextureManager::DeleteAll()
{
	for (unsigned int i = 0; i < Textures.Size(); ++i)
	{
		delete Textures[i].Texture;
	}
	Textures.Clear();
	Translation.Clear();
	FirstTextureForFile.Clear();
	memset (HashFirst, -1, sizeof(HashFirst));
	DefaultTexture.SetInvalid();

	for (unsigned i = 0; i < mAnimations.Size(); i++)
	{
		if (mAnimations[i] != NULL)
		{
			M_Free (mAnimations[i]);
			mAnimations[i] = NULL;
		}
	}
	mAnimations.Clear();

	for (unsigned i = 0; i < mSwitchDefs.Size(); i++)
	{
		if (mSwitchDefs[i] != NULL)
		{
			M_Free (mSwitchDefs[i]);
			mSwitchDefs[i] = NULL;
		}
	}
	mSwitchDefs.Clear();

	for (unsigned i = 0; i < mAnimatedDoors.Size(); i++)
	{
		if (mAnimatedDoors[i].TextureFrames != NULL)
		{
			delete[] mAnimatedDoors[i].TextureFrames;
			mAnimatedDoors[i].TextureFrames = NULL;
		}
	}
	mAnimatedDoors.Clear();

	for (unsigned int i = 0; i < BuildTileFiles.Size(); ++i)
	{
		delete[] BuildTileFiles[i];
	}
	BuildTileFiles.Clear();
}